

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandUnfold(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nFrames;
  uint uVar2;
  Abc_Ntk_t *pNtk;
  Aig_Man_t *pAVar3;
  Gia_Man_t *p;
  Gia_Man_t *p_00;
  Abc_Ntk_t *pNtk_00;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  local_44 = 0;
  Extra_UtilGetoptReset();
  nFrames = 1;
  local_54 = 1000;
  local_50 = 1000;
  local_4c = 0;
  local_48 = 0;
LAB_0024278b:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"FCPsavh");
    iVar5 = globalUtilOptind;
    if (iVar1 == 0x46) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-F\" should be followed by an integer.\n";
        goto LAB_002428a4;
      }
      nFrames = atoi(argv[globalUtilOptind]);
      uVar2 = nFrames;
    }
    else {
      if (iVar1 == -1) {
        if (pNtk != (Abc_Ntk_t *)0x0) {
          if (pNtk->nObjCounts[8] == 0) {
            if (pNtk->vPos->nSize < 2) {
              pAVar3 = Abc_NtkToDar(pNtk,0,0);
              p = Gia_ManFromAigSimple(pAVar3);
              Aig_ManStop(pAVar3);
              p_00 = Gia_ManDupWithConstr(p);
              Gia_ManStop(p);
              if (p_00 != (Gia_Man_t *)0x0) {
                pAVar3 = Gia_ManToAigSimple(p_00);
                Gia_ManStop(p_00);
                pNtk_00 = Abc_NtkFromAigPhase(pAVar3);
                Aig_ManStop(pAVar3);
                if (pNtk_00->pName != (char *)0x0) {
                  free(pNtk_00->pName);
                  pNtk_00->pName = (char *)0x0;
                }
                pcVar4 = Extra_UtilStrsav(pNtk->pName);
                pNtk_00->pName = pcVar4;
LAB_00242a9f:
                Abc_FrameReplaceCurrentNetwork(pAbc,pNtk_00);
                return 0;
              }
              pcVar4 = "Cannot extract constrains from the miter.\n";
            }
            else {
              pcVar4 = "Combinational miter has more than one PO.\n";
            }
          }
          else if (pNtk->ntkType == ABC_NTK_STRASH) {
            if (pNtk->nConstrs < 1) {
              if (local_44 != 0 || pNtk->vPos->nSize < 2) {
                pNtk_00 = Abc_NtkDarUnfold(pNtk,nFrames,local_54,local_50,local_44,local_4c,local_48
                                          );
                if (pNtk_00 != (Abc_Ntk_t *)0x0) goto LAB_00242a9f;
                pcVar4 = "Transformation has failed.\n";
                iVar5 = 1;
                goto LAB_002429bd;
              }
              pcVar4 = 
              "Functional constraint extraction works for single-output miters (use \"orpos\").\n";
            }
            else {
              pcVar4 = "Constraints are already extracted.\n";
            }
          }
          else {
            pcVar4 = "Currently only works for structurally hashed circuits.\n";
          }
          iVar5 = -1;
LAB_002429bd:
          Abc_Print(iVar5,pcVar4);
          return 0;
        }
        pcVar4 = "Empty network.\n";
        iVar5 = -1;
        goto LAB_00242977;
      }
      if (iVar1 == 0x43) {
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_002428a4:
          Abc_Print(-1,pcVar4);
          goto LAB_002428ae;
        }
        local_54 = atoi(argv[globalUtilOptind]);
        uVar2 = local_54;
      }
      else {
        if (iVar1 != 0x50) {
          if (iVar1 == 0x61) {
            local_4c = local_4c ^ 1;
          }
          else if (iVar1 == 0x73) {
            local_44 = local_44 ^ 1;
          }
          else {
            if (iVar1 != 0x76) goto LAB_002428ae;
            local_48 = local_48 ^ 1;
          }
          goto LAB_0024278b;
        }
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-P\" should be followed by an integer.\n";
          goto LAB_002428a4;
        }
        local_50 = atoi(argv[globalUtilOptind]);
        uVar2 = local_50;
      }
    }
    globalUtilOptind = iVar5 + 1;
    if ((int)uVar2 < 0) {
LAB_002428ae:
      iVar5 = -2;
      Abc_Print(-2,"usage: unfold [-FCP num] [-savh]\n");
      Abc_Print(-2,"\t         unfold hidden constraints as separate outputs\n");
      Abc_Print(-2,"\t-F num : the max number of timeframes to consider [default = %d]\n",
                (ulong)nFrames);
      Abc_Print(-2,"\t-C num : the max number of conflicts in SAT solving [default = %d]\n",
                (ulong)local_54);
      Abc_Print(-2,"\t-P num : the max number of constraint propagations [default = %d]\n",
                (ulong)local_50);
      pcVar6 = "yes";
      pcVar4 = "yes";
      if (local_44 == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-s     : toggle detecting structural constraints [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (local_4c == 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-a     : toggle fast implication detection [default = %s]\n",pcVar4);
      if (local_48 == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar6);
      pcVar4 = "\t-h     : print the command usage\n";
LAB_00242977:
      Abc_Print(iVar5,pcVar4);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandUnfold( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int nFrames;
    int nConfs;
    int nProps;
    int fStruct;
    int fOldAlgo;
    int fVerbose;
    int c;
    extern Abc_Ntk_t * Abc_NtkDarUnfold( Abc_Ntk_t * pNtk, int nFrames, int nConfs, int nProps, int fStruct, int fOldAlgo, int fVerbose );
    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    nFrames   =      1;
    nConfs    =   1000;
    nProps    =   1000;
    fStruct   =      0;
    fOldAlgo  =      0;
    fVerbose  =      0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FCPsavh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfs < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            nProps = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nProps < 0 )
                goto usage;
            break;
        case 's':
            fStruct ^= 1;
            break;
        case 'a':
            fOldAlgo ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkIsComb(pNtk) && Abc_NtkPoNum(pNtk) > 1 )
    {
        Abc_Print( -1, "Combinational miter has more than one PO.\n" );
        return 0;
    }
    if ( Abc_NtkIsComb(pNtk) )
    {
        extern Gia_Man_t * Gia_ManDupWithConstr( Gia_Man_t * p );
        Gia_Man_t * pNew;
        Aig_Man_t * pAig = Abc_NtkToDar( pNtk, 0, 0 );
        Gia_Man_t * pGia = Gia_ManFromAigSimple( pAig );
        Aig_ManStop( pAig );
        pNew = Gia_ManDupWithConstr( pGia );
        Gia_ManStop( pGia );
        if ( pNew == NULL )
        {
            Abc_Print( -1, "Cannot extract constrains from the miter.\n" );
            return 0;
        }
        pAig = Gia_ManToAigSimple( pNew );
        Gia_ManStop( pNew );
        pNtkRes = Abc_NtkFromAigPhase( pAig );
        Aig_ManStop( pAig );
        ABC_FREE( pNtkRes->pName );
        pNtkRes->pName = Extra_UtilStrsav( pNtk->pName );
        // replace the current network
        Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
        return 0;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Currently only works for structurally hashed circuits.\n" );
        return 0;
    }
    if ( Abc_NtkConstrNum(pNtk) > 0 )
    {
        Abc_Print( -1, "Constraints are already extracted.\n" );
        return 0;
    }
    if ( Abc_NtkPoNum(pNtk) > 1 && !fStruct )
    {
        Abc_Print( -1, "Functional constraint extraction works for single-output miters (use \"orpos\").\n" );
        return 0;
    }
    // modify the current network
    pNtkRes = Abc_NtkDarUnfold( pNtk, nFrames, nConfs, nProps, fStruct, fOldAlgo, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( 1,"Transformation has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;
usage:
    Abc_Print( -2, "usage: unfold [-FCP num] [-savh]\n" );
    Abc_Print( -2, "\t         unfold hidden constraints as separate outputs\n" );
    Abc_Print( -2, "\t-F num : the max number of timeframes to consider [default = %d]\n", nFrames );
    Abc_Print( -2, "\t-C num : the max number of conflicts in SAT solving [default = %d]\n", nConfs );
    Abc_Print( -2, "\t-P num : the max number of constraint propagations [default = %d]\n", nProps );
    Abc_Print( -2, "\t-s     : toggle detecting structural constraints [default = %s]\n", fStruct? "yes": "no" );
    Abc_Print( -2, "\t-a     : toggle fast implication detection [default = %s]\n", !fOldAlgo? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}